

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_4.cpp
# Opt level: O1

optional<int> parse_and_evaluate(string *_expression)

{
  byte *pbVar1;
  pointer pcVar2;
  optional<Operator> oVar3;
  ostream *poVar4;
  byte bVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  char local_3a [2];
  size_t local_38;
  
  uVar11 = 0x100000000;
  local_38 = 0;
  pbVar1 = (byte *)(_expression->_M_dataplus)._M_p;
  bVar5 = *pbVar1;
  uVar14 = 0;
  if (0xf5 < (byte)(bVar5 - 0x3a)) {
    local_38 = 0;
    do {
      uVar12 = ((uint)bVar5 + (int)uVar14 * 10) - 0x30;
      uVar14 = (ulong)uVar12;
      bVar5 = pbVar1[local_38 + 1];
      local_38 = local_38 + 1;
    } while ((byte)(bVar5 - 0x30) < 10);
    uVar14 = (ulong)uVar12 | 0x100000000;
  }
  if ((uVar14 & 0x100000000) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Could not parse first number.\n",0x1e);
  }
  else {
    do {
      if (_expression->_M_string_length <= local_38) goto LAB_00101520;
      oVar3 = parse_operator(_expression,&local_38);
      if (((ulong)oVar3.super__Optional_base<Operator,_true,_true>._M_payload.
                  super__Optional_payload_base<Operator> & 0x100000000) == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Failed to parse operator at offset: ",0x24);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        local_3a[0] = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_3a,1);
        iVar6 = 3;
      }
      else {
        pcVar2 = (_expression->_M_dataplus)._M_p;
        bVar5 = pcVar2[local_38];
        if ((byte)(bVar5 - 0x3a) < 0xf6) {
          uVar9 = 0;
        }
        else {
          uVar12 = 0;
          do {
            uVar12 = ((uint)bVar5 + uVar12 * 10) - 0x30;
            bVar5 = pcVar2[local_38 + 1];
            local_38 = local_38 + 1;
          } while ((byte)(bVar5 - 0x30) < 10);
          uVar9 = (ulong)uVar12 | 0x100000000;
        }
        if ((uVar9 & 0x100000000) == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Failed to parse next operand at offset ",0x27);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          local_3a[1] = 10;
          lVar7 = 1;
          pcVar10 = local_3a + 1;
LAB_001014be:
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar10,lVar7);
          iVar6 = 1;
        }
        else {
          iVar6 = 0;
          iVar8 = (int)uVar9;
          iVar13 = (int)uVar14;
          switch((ulong)oVar3.super__Optional_base<Operator,_true,_true>._M_payload.
                        super__Optional_payload_base<Operator> & 0xffffffff) {
          case 0:
            uVar14 = (ulong)(uint)(iVar13 + iVar8);
            break;
          case 1:
            uVar14 = (ulong)(uint)(iVar13 - iVar8);
            break;
          case 2:
            uVar14 = (ulong)(uint)(iVar13 * iVar8);
            break;
          case 3:
            if (iVar8 == 0) {
              lVar7 = 0x1f;
              poVar4 = (ostream *)&std::cerr;
              pcVar10 = "Division by zero is undefined.\n";
              goto LAB_001014be;
            }
            uVar14 = (long)((ulong)(uint)(iVar13 >> 0x1f) << 0x20 | uVar14 & 0xffffffff) /
                     (long)iVar8 & 0xffffffff;
          }
        }
      }
    } while (iVar6 == 0);
    if (iVar6 == 3) {
LAB_00101520:
      uVar14 = uVar14 & 0xffffffff;
      goto LAB_0010152a;
    }
  }
  uVar14 = 0;
  uVar11 = 0;
LAB_0010152a:
  return (optional<int>)(uVar14 | uVar11);
}

Assistant:

optional<number_type> parse_and_evaluate(string const& _expression)
{
	size_t parseOffset = 0;
	optional<number_type> const first_value = parse_number(_expression, parseOffset);
	if (!first_value.has_value())
	{
		cerr << "Could not parse first number.\n";
		return nullopt;
	}

	number_type result = first_value.value();

	while (parseOffset < _expression.size())
	{
		optional<Operator> const op = parse_operator(_expression, parseOffset);
		if (!op.has_value())
		{
			cerr << "Failed to parse operator at offset: " << parseOffset << '\n';
			break;
		}

		optional<number_type> const rhs = parse_number(_expression, parseOffset);
		if (!rhs.has_value())
		{
			cerr << "Failed to parse next operand at offset " << parseOffset << '\n';
			return nullopt;
		}

		switch (op.value())
		{
			case Operator::Plus:
				result = result + rhs.value();
				break;
			case Operator::Minus:
				result = result - rhs.value();
				break;
			case Operator::Multiply:
				result = result * rhs.value();
				break;
			case Operator::Divide:
				if (rhs.value() != 0)
					result = result / rhs.value();
				else
				{
					cerr << "Division by zero is undefined.\n";
					return nullopt;
				}
				break;
		}
	}
	return result;
}